

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vhost.c
# Opt level: O2

lws_vhost * lws_get_vhost_by_name(lws_context *context,char *name)

{
  lws_vhost *plVar1;
  int iVar2;
  lws_vhost **pplVar3;
  
  pplVar3 = &context->vhost_list;
  while( true ) {
    plVar1 = *pplVar3;
    if (plVar1 == (lws_vhost *)0x0) {
      return (lws_vhost *)0x0;
    }
    iVar2 = strcmp(plVar1->name,name);
    if (iVar2 == 0) break;
    pplVar3 = &plVar1->vhost_next;
  }
  return plVar1;
}

Assistant:

struct lws_vhost *
lws_get_vhost_by_name(struct lws_context *context, const char *name)
{
	lws_start_foreach_ll(struct lws_vhost *, v,
			     context->vhost_list) {
		if (!strcmp(v->name, name))
			return v;

	} lws_end_foreach_ll(v, vhost_next);

	return NULL;
}